

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationTests.cpp
# Opt level: O1

void vkt::synchronization::anon_unknown_1::createBasicTests(TestCaseGroup *group)

{
  TestNode *pTVar1;
  
  pTVar1 = &createBasicFenceTests((group->super_TestNode).m_testCtx)->super_TestNode;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = &createBasicSemaphoreTests((group->super_TestNode).m_testCtx)->super_TestNode;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = &createBasicEventTests((group->super_TestNode).m_testCtx)->super_TestNode;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  return;
}

Assistant:

void createBasicTests (tcu::TestCaseGroup* group)
{
	group->addChild(createBasicFenceTests	 (group->getTestContext()));
	group->addChild(createBasicSemaphoreTests(group->getTestContext()));
	group->addChild(createBasicEventTests	 (group->getTestContext()));
}